

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_MemEncode
               (CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,int writeEndMark,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  ISeqOutStream local_68;
  CSeqOutStreamBuf outStream;
  CLzmaEnc *p;
  SRes res;
  int writeEndMark_local;
  SizeT srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  CLzmaEncHandle pp_local;
  
  outStream._24_8_ = pp;
  LzmaEnc_SetInputBuf((CLzmaEnc *)pp,src,srcLen);
  local_68.Write = MyWrite;
  outStream.data = (Byte *)*destLen;
  outStream.rem._0_4_ = 0;
  *(int *)(outStream._24_8_ + 0x3d330) = writeEndMark;
  outStream.funcTable.Write = (_func_size_t_void_ptr_void_ptr_size_t *)dest;
  pp_local._4_4_ =
       LzmaEnc_Encode(pp,&local_68,(ISeqInStream *)(outStream._24_8_ + 0x3d360),progress,alloc,
                      allocBig);
  *destLen = *destLen - (long)outStream.data;
  if ((int)outStream.rem != 0) {
    pp_local._4_4_ = 7;
  }
  return pp_local._4_4_;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                       int writeEndMark, ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  SRes res;
  CLzmaEnc* p = (CLzmaEnc*)pp;

  CSeqOutStreamBuf outStream;

  LzmaEnc_SetInputBuf(p, src, srcLen);

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  res = LzmaEnc_Encode(pp, &outStream.funcTable, &p->seqBufInStream.funcTable,
                       progress, alloc, allocBig);

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}